

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

int build_regex_nfa(LexState *ls,uint8 **areg,NFAState *pp,NFAState *nn,Action *trailing)

{
  long lVar1;
  uint *v;
  Action **ppAVar2;
  anon_struct_40_4_d8687ec6_for_accepts *v_00;
  byte bVar3;
  uint uVar4;
  int iVar5;
  Action **ppAVar6;
  long lVar7;
  NFAState **ppNVar8;
  uint8 **ppuVar9;
  byte bVar10;
  int iVar11;
  byte *pbVar12;
  ushort **ppuVar13;
  NFAState *pNVar14;
  __int32_t **pp_Var15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  NFAState **ppNVar20;
  char *pcVar21;
  NFAState *pNVar22;
  anon_struct_40_4_d8687ec6_for_epsilon *paVar23;
  anon_struct_40_4_d8687ec6 *v_01;
  long lVar24;
  long lVar25;
  byte *pbVar26;
  uint8 mark [256];
  byte *local_168;
  uint8 **local_160;
  Action *local_158;
  anon_struct_40_4_d8687ec6_for_epsilon *local_150;
  NFAState **local_148;
  NFAState *local_140;
  char local_138 [264];
  
  local_150 = &pp->epsilon;
  local_148 = (pp->epsilon).e;
  uVar17 = 0;
  local_168 = *areg;
  pNVar14 = pp;
  local_160 = areg;
  local_158 = trailing;
  local_140 = pp;
LAB_00140adb:
  pNVar22 = pNVar14;
  ppuVar9 = local_160;
  pbVar12 = local_168 + 1;
  bVar3 = *local_168;
  uVar18 = (ulong)bVar3;
  pNVar14 = pNVar22;
  if (bVar3 < 0x3f) {
    local_168 = pbVar12;
    switch(bVar3) {
    case 0x28:
      pNVar14 = new_NFAState(ls);
      iVar11 = build_regex_nfa(ls,&local_168,pNVar22,pNVar14,trailing);
      uVar17 = (uint)(iVar11 != 0 || uVar17 != 0);
      pp = pNVar22;
      goto LAB_00140adb;
    case 0x29:
      goto switchD_00140b08_caseD_29;
    case 0x2a:
      ppNVar20 = (pp->epsilon).v;
      ppNVar8 = (pp->epsilon).e;
      if (ppNVar20 == (NFAState **)0x0) {
        (pp->epsilon).v = ppNVar8;
        uVar4 = (pp->epsilon).n;
        (pp->epsilon).n = uVar4 + 1;
        (pp->epsilon).e[uVar4] = pNVar22;
      }
      else {
        paVar23 = &pp->epsilon;
        uVar4 = paVar23->n;
        if (ppNVar20 == ppNVar8) {
          if (2 < uVar4) goto LAB_00140fb2;
        }
        else if ((uVar4 & 7) == 0) {
LAB_00140fb2:
          vec_add_internal(paVar23,pNVar22);
          goto switchD_00140b08_caseD_2b;
        }
        paVar23->n = uVar4 + 1;
        ppNVar20[uVar4] = pNVar22;
      }
    case 0x2b:
switchD_00140b08_caseD_2b:
      ppNVar20 = (pNVar22->epsilon).v;
      ppNVar8 = (pNVar22->epsilon).e;
      if (ppNVar20 == (NFAState **)0x0) {
        (pNVar22->epsilon).v = ppNVar8;
        uVar4 = (pNVar22->epsilon).n;
        (pNVar22->epsilon).n = uVar4 + 1;
        (pNVar22->epsilon).e[uVar4] = pp;
        goto LAB_00140adb;
      }
      paVar23 = &pNVar22->epsilon;
      uVar4 = paVar23->n;
      pNVar22 = pp;
      if (ppNVar20 == ppNVar8) {
        if (uVar4 < 3) goto LAB_00141019;
      }
      else if ((uVar4 & 7) != 0) {
LAB_00141019:
        paVar23->n = uVar4 + 1;
        ppNVar20[uVar4] = pp;
        goto LAB_00140adb;
      }
      break;
    case 0x2f:
      ppAVar6 = (pNVar22->accepts).v;
      ppAVar2 = (pNVar22->accepts).e;
      if (ppAVar6 == (Action **)0x0) {
        (pNVar22->accepts).v = ppAVar2;
        uVar17 = (pNVar22->accepts).n;
        (pNVar22->accepts).n = uVar17 + 1;
        (pNVar22->accepts).e[uVar17] = trailing;
      }
      else {
        v_00 = &pNVar22->accepts;
        uVar17 = v_00->n;
        if (ppAVar6 == ppAVar2) {
          if (2 < uVar17) goto LAB_0014103d;
        }
        else if ((uVar17 & 7) == 0) {
LAB_0014103d:
          vec_add_internal(v_00,trailing);
          goto LAB_00141045;
        }
        v_00->n = uVar17 + 1;
        ppAVar6[uVar17] = trailing;
      }
LAB_00141045:
      uVar17 = 1;
      goto LAB_00140adb;
    default:
      if (bVar3 == 0) goto switchD_00140b08_caseD_29;
    case 0x2c:
    case 0x2d:
    case 0x2e:
switchD_00140b08_caseD_2c:
      local_168 = pbVar12;
      if ((ls->ignore_case == 0) ||
         (ppuVar13 = __ctype_b_loc(), (*(byte *)((long)*ppuVar13 + uVar18 * 2 + 1) & 4) == 0)) {
        v_01 = pNVar22->chars + uVar18;
        ppNVar8 = pNVar22->chars[uVar18].v;
        if (ppNVar8 == (NFAState **)0x0) {
          pNVar14 = new_NFAState(ls);
          pNVar22->chars[uVar18].v = pNVar22->chars[uVar18].e;
          uVar4 = v_01->n;
          v_01->n = uVar4 + 1;
          pNVar22->chars[uVar18].e[uVar4] = pNVar14;
          pp = pNVar22;
        }
        else {
          if (ppNVar8 == pNVar22->chars[uVar18].e) {
            if (2 < v_01->n) goto LAB_00140f89;
          }
          else if ((v_01->n & 7) == 0) {
LAB_00140f89:
            pNVar14 = new_NFAState(ls);
            goto LAB_0014123b;
          }
          pNVar14 = new_NFAState(ls);
          ppNVar8 = pNVar22->chars[uVar18].v;
          uVar4 = v_01->n;
          v_01->n = uVar4 + 1;
          ppNVar8[uVar4] = pNVar14;
          pp = pNVar22;
        }
        goto LAB_00140adb;
      }
      pp_Var15 = __ctype_tolower_loc();
      iVar11 = (*pp_Var15)[uVar18];
      ppNVar8 = pNVar22->chars[iVar11].v;
      if (ppNVar8 == (NFAState **)0x0) {
        pNVar14 = new_NFAState(ls);
        uVar19 = (ulong)(uint)((int)uVar18 * 4);
        iVar11 = *(int *)((long)*pp_Var15 + uVar19);
        ppNVar8 = pNVar22->chars[iVar11].e;
        ppNVar8[-1] = (NFAState *)ppNVar8;
        iVar5 = *(int *)((long)*pp_Var15 + uVar19);
        uVar4 = pNVar22->chars[iVar5].n;
        pNVar22->chars[iVar5].n = uVar4 + 1;
        pNVar22->chars[iVar11].e[uVar4] = pNVar14;
      }
      else {
        uVar4 = pNVar22->chars[iVar11].n;
        if (ppNVar8 == pNVar22->chars[iVar11].e) {
          if (uVar4 < 3) goto LAB_00140f27;
        }
        else if ((uVar4 & 7) != 0) {
LAB_00140f27:
          pNVar14 = new_NFAState(ls);
          iVar11 = (*pp_Var15)[uVar18];
          ppNVar8 = pNVar22->chars[iVar11].v;
          uVar4 = pNVar22->chars[iVar11].n;
          pNVar22->chars[iVar11].n = uVar4 + 1;
          ppNVar8[uVar4] = pNVar14;
          goto LAB_001411b3;
        }
        pNVar14 = new_NFAState(ls);
        vec_add_internal(pNVar22->chars + iVar11,pNVar14);
      }
LAB_001411b3:
      pp_Var15 = __ctype_toupper_loc();
      v_01 = pNVar22->chars + (*pp_Var15)[uVar18];
      ppNVar8 = v_01->v;
      ppNVar20 = pNVar22->chars[(*pp_Var15)[uVar18]].e;
      trailing = local_158;
      if (ppNVar8 != (NFAState **)0x0) {
        uVar4 = v_01->n;
        if (ppNVar8 == ppNVar20) {
          if (uVar4 < 3) goto LAB_00141230;
        }
        else if ((uVar4 & 7) != 0) {
LAB_00141230:
          v_01->n = uVar4 + 1;
          ppNVar8[uVar4] = pNVar14;
          pp = pNVar22;
          goto LAB_00140adb;
        }
LAB_0014123b:
        vec_add_internal(v_01,pNVar14);
        pp = pNVar22;
        goto LAB_00140adb;
      }
      v_01->v = ppNVar20;
      uVar4 = pNVar22->chars[(*pp_Var15)[uVar18]].n;
      pNVar22->chars[(*pp_Var15)[uVar18]].n = uVar4 + 1;
      v_01->e[uVar4] = pNVar14;
      pp = pNVar22;
      goto LAB_00140adb;
    }
  }
  else {
    if (0x5b < bVar3) {
      if (bVar3 != 0x5c) {
        if (bVar3 != 0x7c) goto switchD_00140b08_caseD_2c;
        ppNVar20 = (pNVar22->epsilon).v;
        ppNVar8 = (pNVar22->epsilon).e;
        if (ppNVar20 == (NFAState **)0x0) {
          (pNVar22->epsilon).v = ppNVar8;
          uVar4 = (pNVar22->epsilon).n;
          (pNVar22->epsilon).n = uVar4 + 1;
          (pNVar22->epsilon).e[uVar4] = nn;
          local_168 = pbVar12;
        }
        else {
          paVar23 = &pNVar22->epsilon;
          uVar4 = paVar23->n;
          if (ppNVar20 == ppNVar8) {
            if (2 < uVar4) goto LAB_00141067;
          }
          else if ((uVar4 & 7) == 0) {
LAB_00141067:
            local_168 = pbVar12;
            vec_add_internal(paVar23,nn);
            goto LAB_00141074;
          }
          paVar23->n = uVar4 + 1;
          ppNVar20[uVar4] = nn;
          local_168 = pbVar12;
        }
LAB_00141074:
        pNVar22 = local_140;
        ppNVar8 = (local_140->epsilon).v;
        if (ppNVar8 == (NFAState **)0x0) {
          pNVar14 = new_NFAState(ls);
          (pNVar22->epsilon).v = local_148;
          uVar4 = (pNVar22->epsilon).n;
          (pNVar22->epsilon).n = uVar4 + 1;
          (pNVar22->epsilon).e[uVar4] = pNVar14;
          goto LAB_00140adb;
        }
        if (ppNVar8 == local_148) {
          if (2 < local_150->n) goto LAB_00141101;
        }
        else if ((local_150->n & 7) == 0) {
LAB_00141101:
          pNVar14 = new_NFAState(ls);
          vec_add_internal(local_150,pNVar14);
          goto LAB_00140adb;
        }
        pNVar14 = new_NFAState(ls);
        uVar4 = (pNVar22->epsilon).n;
        (pNVar22->epsilon).n = uVar4 + 1;
        (pNVar22->epsilon).v[uVar4] = pNVar14;
        goto LAB_00140adb;
      }
      pbVar12 = local_168 + 2;
      pbVar26 = local_168 + 1;
      uVar18 = (ulong)*pbVar26;
      local_168 = pbVar12;
      if (*pbVar26 == 0) {
LAB_00141250:
        d_fail("bad (part of) regex: %s\n",*local_160);
        return uVar17;
      }
      goto switchD_00140b08_caseD_2c;
    }
    if (bVar3 != 0x3f) {
      if (bVar3 == 0x5b) {
        bVar3 = *pbVar12;
        if (bVar3 == 0x5e) {
          pbVar12 = local_168 + 2;
        }
        local_168 = pbVar12;
        memset(local_138,0,0x100);
        bVar10 = 0xff;
LAB_00140b80:
        do {
          pbVar26 = pbVar12 + 1;
          bVar16 = *pbVar12;
          if (bVar16 < 0x5c) {
            if (bVar16 == 0x2d) {
              bVar16 = pbVar12[1];
              if (bVar16 == 0x5c) {
                bVar16 = pbVar12[2];
                pbVar12 = pbVar12 + 3;
              }
              else {
                if (bVar16 == 0) goto LAB_00141250;
                pbVar12 = pbVar12 + 2;
              }
              if (bVar16 == 0) goto LAB_00141250;
              for (; bVar10 <= bVar16; bVar10 = bVar10 + 1) {
                local_138[bVar10] = '\x01';
              }
              goto LAB_00140b80;
            }
            if (bVar16 == 0) goto LAB_00140d1a;
          }
          else if (bVar16 == 0x5c) {
            bVar16 = pbVar12[1];
            pbVar26 = pbVar12 + 2;
          }
          else if (bVar16 == 0x5d) goto LAB_00140d1a;
          local_138[bVar16] = '\x01';
          pbVar12 = pbVar26;
          bVar10 = bVar16;
        } while( true );
      }
      goto switchD_00140b08_caseD_2c;
    }
    ppNVar20 = (pp->epsilon).v;
    ppNVar8 = (pp->epsilon).e;
    if (ppNVar20 == (NFAState **)0x0) {
      (pp->epsilon).v = ppNVar8;
      uVar4 = (pp->epsilon).n;
      (pp->epsilon).n = uVar4 + 1;
      (pp->epsilon).e[uVar4] = pNVar22;
      local_168 = pbVar12;
      goto LAB_00140adb;
    }
    paVar23 = &pp->epsilon;
    uVar4 = paVar23->n;
    if (ppNVar20 == ppNVar8) {
      local_168 = pbVar12;
      if (2 < uVar4) goto LAB_00141134;
LAB_00141129:
      paVar23->n = uVar4 + 1;
      ppNVar20[uVar4] = pNVar22;
      local_168 = pbVar12;
      goto LAB_00140adb;
    }
    local_168 = pbVar12;
    if ((uVar4 & 7) != 0) goto LAB_00141129;
  }
LAB_00141134:
  vec_add_internal(paVar23,pNVar22);
  goto LAB_00140adb;
LAB_00140d1a:
  local_168 = pbVar26;
  pNVar14 = new_NFAState(ls);
  lVar25 = 0x40;
  lVar24 = 0x30;
  pcVar21 = local_138;
  do {
    pcVar21 = pcVar21 + 1;
    if ((*pcVar21 == '\0') == (bVar3 == 0x5e)) {
      lVar7 = *(long *)((long)pNVar22->chars[0].e + lVar24 + -0x10);
      lVar1 = (long)pNVar22->chars[0].e + lVar25 + -0x18;
      if (lVar7 == 0) {
        *(long *)((long)pNVar22->chars[0].e + lVar24 + -0x10) = lVar1;
        uVar4 = *(uint *)((long)pNVar22->chars[0].e + lVar24 + -0x18);
        *(uint *)((long)pNVar22->chars[0].e + lVar24 + -0x18) = uVar4 + 1;
        *(NFAState **)((long)pNVar22->chars[0].e + lVar25 + (ulong)uVar4 * 8 + -0x18) = pNVar14;
      }
      else {
        v = (uint *)((long)pNVar22->chars[0].e + lVar24 + -0x18);
        uVar4 = *v;
        if (lVar1 == lVar7) {
          if (2 < uVar4) goto LAB_00140da0;
        }
        else if ((uVar4 & 7) == 0) {
LAB_00140da0:
          vec_add_internal(v,pNVar14);
          goto LAB_00140da8;
        }
        *v = uVar4 + 1;
        *(NFAState **)(lVar7 + (ulong)uVar4 * 8) = pNVar14;
      }
    }
LAB_00140da8:
    lVar25 = lVar25 + 0x28;
    lVar24 = lVar24 + 0x28;
    pp = pNVar22;
    trailing = local_158;
  } while (lVar25 != 0x2818);
  goto LAB_00140adb;
switchD_00140b08_caseD_29:
  ppNVar20 = (pNVar22->epsilon).v;
  ppNVar8 = (pNVar22->epsilon).e;
  if (ppNVar20 == (NFAState **)0x0) {
    (pNVar22->epsilon).v = ppNVar8;
    uVar4 = (pNVar22->epsilon).n;
    (pNVar22->epsilon).n = uVar4 + 1;
    (pNVar22->epsilon).e[uVar4] = nn;
    goto LAB_0014130c;
  }
  paVar23 = &pNVar22->epsilon;
  uVar4 = paVar23->n;
  if (ppNVar20 == ppNVar8) {
    if (2 < uVar4) goto LAB_001412ff;
  }
  else if ((uVar4 & 7) == 0) {
LAB_001412ff:
    vec_add_internal(paVar23,nn);
    goto LAB_0014130c;
  }
  paVar23->n = uVar4 + 1;
  ppNVar20[uVar4] = nn;
LAB_0014130c:
  *ppuVar9 = pbVar12;
  return uVar17;
}

Assistant:

static int build_regex_nfa(LexState *ls, uint8 **areg, NFAState *pp, NFAState *nn, Action *trailing) {
  uint8 c, pc, *reg = *areg;
  NFAState *p = pp, *s, *x, *n = nn;
  int reversed, i, has_trailing = 0;
  uint8 mark[256];

  s = p;
  while ((c = *reg++)) {
    switch (c) {
      case '(':
        has_trailing = build_regex_nfa(ls, &reg, s, (x = new_NFAState(ls)), trailing) || has_trailing;
        p = s;
        s = x;
        break;
      case ')':
        goto Lreturn;
      case '|':
        vec_add(&s->epsilon, nn);
        vec_add(&pp->epsilon, (s = new_NFAState(ls)));
        break;
      case '[':
        if (*reg == '^') {
          reg++;
          reversed = 1;
        } else
          reversed = 0;
        memset(mark, 0, sizeof(mark));
        pc = UCHAR_MAX;
        while ((c = *reg++)) {
          switch (c) {
            case ']':
              goto Lsetdone;
            case '-':
              c = *reg++;
              if (!c) goto Lerror;
              if (c == '\\') c = *reg++;
              if (!c) goto Lerror;
              for (; pc <= c; pc++) mark[pc] = 1;
              break;
            case '\\':
              c = *reg++;
              /* fall through */
            default:
              pc = c;
              mark[c] = 1;
              break;
          }
        }
      Lsetdone:
        x = new_NFAState(ls);
        for (i = 1; i < 256; i++)
          if ((!reversed && mark[i]) || (reversed && !mark[i])) vec_add(&s->chars[i], x);
        p = s;
        s = x;
        break;
      case '?':
        vec_add(&p->epsilon, s);
        break;
      case '*':
        vec_add(&p->epsilon, s);
        vec_add(&s->epsilon, p);
        break;
      case '+':
        vec_add(&s->epsilon, p);
        break;
      case '/':
        vec_add(&s->accepts, trailing);
        has_trailing = 1;
        break;
      case '\\':
        c = *reg++;
        if (!c) goto Lerror;
        /* fall through */
      default:
        if (!ls->ignore_case || !isalpha(c))
          vec_add(&s->chars[c], (x = new_NFAState(ls)));
        else {
          vec_add(&s->chars[tolower(c)], (x = new_NFAState(ls)));
          vec_add(&s->chars[toupper(c)], x);
        }
        p = s;
        s = x;
        break;
    }
  }
Lreturn:
  vec_add(&s->epsilon, n);
  *areg = reg;
  return has_trailing;
Lerror:
  d_fail("bad (part of) regex: %s\n", *areg);
  return has_trailing;
}